

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Configlist_reset(void)

{
  int iVar1;
  s_x4 *psVar2;
  long lVar3;
  
  psVar2 = x4a;
  current = (config *)0x0;
  currentend = &current;
  basis = (config *)0x0;
  basisend = &basis;
  if ((x4a != (s_x4 *)0x0) && (x4a->count != 0)) {
    iVar1 = x4a->size;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        psVar2->ht[lVar3] = (s_x4node *)0x0;
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
    psVar2->count = 0;
  }
  return;
}

Assistant:

void Configlist_reset(){
  current = 0;
  currentend = &current;
  basis = 0;
  basisend = &basis;
  Configtable_clear(0);
  return;
}